

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.cc
# Opt level: O2

void __thiscall lock::lock(lock *this,int *lockParameters,char *name)

{
  if (lockParameters != (int *)0x0) {
    this->slope = *lockParameters;
    this->offset = lockParameters[1];
    this->modulo = lockParameters[2];
    this->name = name;
    this->aRealKey[0] = '\0';
    this->aRealKey[1] = '\0';
    this->aRealKey[2] = '\0';
    this->aRealKey[3] = '\0';
    this->aRealKey[4] = '\0';
    this->aRealKey[5] = '\0';
    this->aRealKey[6] = '\0';
    this->aRealKey[7] = '\0';
    this->aRealKey[8] = '\0';
    this->aRealKey[9] = '\0';
    this->aRealKey[10] = '\0';
    this->aRealKey[0xb] = '\0';
    this->aRealKey[0xc] = '\0';
    this->aRealKey[0xd] = '\0';
    this->aRealKey[0xe] = '\0';
    this->aRealKey[0xf] = '\0';
    this->aRealKey[0x10] = '\0';
    this->aRealKey[0x11] = '\0';
    this->aRealKey[0x12] = '\0';
    this->aRealKey[0x13] = '\0';
    this->aRealKey[0x14] = '\0';
    this->aRealKey[0x15] = '\0';
    this->aRealKey[0x16] = '\0';
    this->aRealKey[0x17] = '\0';
    this->aRealKey[0x18] = '\0';
    this->aRealKey[0x19] = '\0';
    this->aRealKey[0x1a] = '\0';
    this->aRealKey[0x1b] = '\0';
    this->aRealKey[0x1c] = '\0';
    this->aRealKey[0x1d] = '\0';
    this->aRealKey[0x1e] = '\0';
    this->aRealKey[0x1f] = '\0';
    this->aRealKeyLength = 0;
    return;
  }
  fwrite("Lock configuration is illegal - no lock defined\n",0x30,1,_stderr);
  exit(-1);
}

Assistant:

lock::lock(int * lockParameters, const char * name) {
  if (lockParameters) {
    slope = *lockParameters++;
    offset = *lockParameters++;
    modulo = *lockParameters++;
    this->name = name;
    memset(aRealKey, 0, sizeof(aRealKey));
    aRealKeyLength = 0;
  } else {
    fprintf(stderr, "Lock configuration is illegal - no lock defined\n");
    exit(-1);
  }
}